

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
duckdb::NotImplementedException::NotImplementedException<std::__cxx11::string,int>
          (NotImplementedException *this,string *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,int params_1)

{
  int in_R8D;
  string local_60;
  string local_40;
  
  ::std::__cxx11::string::string((string *)&local_40,(string *)params);
  Exception::ConstructMessage<std::__cxx11::string,int>
            (&local_60,(Exception *)msg,&local_40,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (ulong)(uint)params_1,in_R8D);
  NotImplementedException(this,(string *)&local_60);
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

explicit NotImplementedException(const string &msg, ARGS... params)
	    : NotImplementedException(ConstructMessage(msg, params...)) {
	}